

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzdohrstructmatrix.cpp
# Opt level: O3

int __thiscall
TPZDohrStructMatrix<double,_TPZStructMatrixOR<double>_>::ClusterIslands
          (TPZDohrStructMatrix<double,_TPZStructMatrixOR<double>_> *this,TPZVec<int> *domain_index,
          int nsub,int connectdimension)

{
  _Rb_tree_color _Var1;
  TPZCompEl *pTVar2;
  int *piVar3;
  size_t sVar4;
  uint uVar5;
  undefined4 uVar6;
  int iVar7;
  TPZCompEl **ppTVar8;
  mapped_type_conflict4 *pmVar9;
  TPZGeoEl *pTVar10;
  long lVar11;
  set<int,_std::less<int>,_std::allocator<int>_> *psVar12;
  _Rb_tree_color *p_Var13;
  _Rb_tree_node_base *p_Var14;
  long lVar15;
  key_type kVar16;
  long lVar17;
  ulong uVar18;
  int64_t iVar19;
  int iVar20;
  _Self __tmp;
  int iVar21;
  set<int,_std::less<int>,_std::allocator<int>_> *psVar22;
  int mydomainindex;
  int celdomain;
  TPZGeoElSide gelside;
  TPZVec<std::set<int,_std::less<int>,_std::allocator<int>_>_> domain_neighbours;
  TPZManVector<int,_10> domain_dest;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> domain_index_count;
  key_type local_1e4;
  int local_1e0;
  int local_1dc;
  long local_1d8;
  long local_1d0;
  TPZVec<int> *local_1c8;
  int local_1c0;
  int local_1bc;
  _func_int **local_1b8;
  undefined1 local_1b0 [8];
  _Rb_tree_node_base local_1a8;
  size_t local_188;
  TPZVec<std::set<int,_std::less<int>,_std::allocator<int>_>_> local_180;
  long local_160;
  long local_158;
  TPZDohrStructMatrix<double,_TPZStructMatrixOR<double>_> *local_150;
  int64_t local_148;
  TPZGeoEl *local_140;
  _func_int **local_138;
  _func_int **local_130;
  ulong local_128;
  TPZStack<TPZCompElSide,_10> local_120;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_60;
  
  iVar20 = *(int *)(*(long *)&this->field_0x8 + 0x7e8);
  lVar11 = *(long *)(*(long *)&this->field_0x8 + 0x48);
  local_160 = (long)nsub;
  local_1d0 = SUB168(SEXT816(lVar11 / local_160) * SEXT816(0x6666666666666667),8);
  local_1dc = nsub;
  local_1c8 = domain_index;
  local_150 = this;
  TPZVec<std::set<int,_std::less<int>,_std::allocator<int>_>_>::TPZVec(&local_180,local_160);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_158 = lVar11;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < lVar11) {
    iVar19 = 0;
    local_130 = (_func_int **)&PTR__TPZGeoElSide_018f8760;
    local_138 = (_func_int **)&PTR__TPZManVector_0181a690;
    local_1b8 = (_func_int **)&PTR__TPZVec_018142b0;
    local_1c0 = connectdimension;
    do {
      ppTVar8 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          ((TPZChunkVector<TPZCompEl_*,_10> *)
                           (*(long *)&local_150->field_0x8 + 0x40),iVar19);
      pTVar2 = *ppTVar8;
      if (pTVar2 != (TPZCompEl *)0x0) {
        local_1e4 = local_1c8->fStore[pTVar2->fIndex];
        pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&local_60,&local_1e4);
        *pmVar9 = *pmVar9 + 1;
        local_148 = iVar19;
        pTVar10 = TPZCompEl::Reference(pTVar2);
        iVar19 = local_148;
        if (pTVar10 != (TPZGeoEl *)0x0) {
          uVar5 = (**(code **)(*(long *)pTVar10 + 0xf0))(pTVar10);
          uVar18 = (ulong)uVar5;
          uVar6 = (**(code **)(*(long *)pTVar10 + 0x210))(pTVar10);
          local_1d8 = CONCAT44(local_1d8._4_4_,uVar6);
          iVar19 = local_148;
          if (0 < (int)uVar5) {
            local_1bc = uVar5 - 1;
            iVar21 = 0;
            local_140 = pTVar10;
            local_128 = uVar18;
            do {
              iVar7 = (**(code **)(*(long *)pTVar10 + 0x208))(pTVar10,iVar21);
              if (((int)local_1d8 < connectdimension || iVar7 == connectdimension) &&
                 ((int)local_1d8 >= connectdimension || iVar21 == local_1bc)) {
                local_1b0 = (undefined1  [8])local_130;
                local_1a8._M_parent = (_Base_ptr)CONCAT44(local_1a8._M_parent._4_4_,iVar21);
                lVar11 = 0x28;
                do {
                  *(undefined8 *)((long)&local_128 + lVar11) = 0;
                  *(undefined4 *)
                   ((long)&(((TPZManVector<TPZCompElSide,_10> *)
                            (local_120.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc + -2))->
                           super_TPZVec<TPZCompElSide>)._vptr_TPZVec + lVar11) = 0xffffffff;
                  lVar11 = lVar11 + 0x10;
                } while (lVar11 != 200);
                local_120.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                fNElements = 0;
                local_120.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNAlloc
                     = 0;
                local_120.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                _vptr_TPZVec = local_138;
                local_1a8._0_8_ = pTVar10;
                local_120.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore =
                     local_120.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc;
                TPZGeoElSide::ConnectedCompElementList((TPZGeoElSide *)local_1b0,&local_120,0,0);
                if (local_120.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                    fNElements < 1) {
LAB_014c1328:
                  local_1e0 = -1;
                  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                  ::_M_insert_unique<int>(&local_180.fStore[local_1e4]._M_t,&local_1e0);
                }
                else {
                  lVar11 = 0;
                  lVar17 = 0;
                  iVar19 = local_120.super_TPZManVector<TPZCompElSide,_10>.
                           super_TPZVec<TPZCompElSide>.fNElements;
                  do {
                    pTVar2 = *(TPZCompEl **)
                              ((long)&(local_120.super_TPZManVector<TPZCompElSide,_10>.
                                       super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar11);
                    pTVar10 = TPZCompEl::Reference(pTVar2);
                    iVar7 = (**(code **)(*(long *)pTVar10 + 0x210))(pTVar10);
                    if (iVar7 == iVar20) {
                      local_1e0 = local_1c8->fStore[pTVar2->fIndex];
                      if (local_1e0 != local_1e4) {
                        std::
                        _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                        _M_insert_unique<int_const&>
                                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                    *)(local_180.fStore + local_1e4),&local_1e0);
                      }
                      lVar17 = lVar17 + 1;
                    }
                    lVar11 = lVar11 + 0x10;
                    iVar19 = iVar19 + -1;
                  } while (iVar19 != 0);
                  pTVar10 = local_140;
                  connectdimension = local_1c0;
                  if (lVar17 == 0) goto LAB_014c1328;
                }
                uVar18 = local_128;
                if (local_120.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                    fStore != local_120.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc) {
                  local_120.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                  fNAlloc = 0;
                  local_120.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                  _vptr_TPZVec = local_1b8;
                  if (local_120.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                      fStore != (TPZCompElSide *)0x0) {
                    operator_delete__(local_120.super_TPZManVector<TPZCompElSide,_10>.
                                      super_TPZVec<TPZCompElSide>.fStore);
                    uVar18 = local_128;
                  }
                }
              }
              iVar21 = iVar21 + 1;
              iVar19 = local_148;
            } while (iVar21 != (int)uVar18);
          }
        }
      }
      iVar19 = iVar19 + 1;
    } while (iVar19 != local_158);
  }
  local_1b0._0_4_ = 0xffffffff;
  TPZManVector<int,_10>::TPZManVector
            ((TPZManVector<int,_10> *)&local_120,local_160,(int *)local_1b0);
  local_1e4 = 0;
  if (local_1dc < 1) {
    lVar11 = 0;
  }
  else {
    local_1d0 = (local_1d0 >> 3) - (local_1d0 >> 0x3f);
    lVar11 = 0;
    iVar20 = local_1dc;
    do {
      lVar17 = (long)local_1e4;
      uVar6 = (undefined4)lVar11;
      if (local_180.fStore[lVar17]._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) {
        lVar15 = (long)(int)local_180.fStore[lVar17]._M_t._M_impl.super__Rb_tree_header._M_header.
                            _M_left[1]._M_color;
        if (lVar15 != -1) {
          iVar21 = *(int *)((long)&(local_120.super_TPZManVector<TPZCompElSide,_10>.
                                    super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar15 * 4);
          if (iVar21 == -1) {
            iVar21 = *(int *)((long)&(local_120.super_TPZManVector<TPZCompElSide,_10>.
                                      super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar17 * 4);
            if (iVar21 == -1) {
              *(undefined4 *)
               ((long)&(local_120.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                       fStore)->fEl + lVar17 * 4) = uVar6;
              *(undefined4 *)
               ((long)&(local_120.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                       fStore)->fEl + lVar15 * 4) = uVar6;
              lVar11 = lVar11 + 1;
            }
            else {
              *(int *)((long)&(local_120.super_TPZManVector<TPZCompElSide,_10>.
                               super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar15 * 4) = iVar21;
            }
          }
          else {
            *(int *)((long)&(local_120.super_TPZManVector<TPZCompElSide,_10>.
                             super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar17 * 4) = iVar21;
          }
        }
      }
      else if (*(int *)((long)&(local_120.super_TPZManVector<TPZCompElSide,_10>.
                                super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar17 * 4) == -1) {
        pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&local_60,&local_1e4);
        lVar17 = (long)local_1e4;
        if (*pmVar9 < local_1d0) {
          local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffff00000000;
          local_1a8._M_parent = (_Base_ptr)0x0;
          local_188 = 0;
          psVar12 = local_180.fStore + lVar17;
          p_Var14 = (psVar12->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          psVar22 = local_180.fStore;
          kVar16 = local_1e4;
          local_1d8 = lVar11;
          local_1a8._M_left = &local_1a8;
          local_1a8._M_right = &local_1a8;
          while ((_Rb_tree_header *)p_Var14 != &(psVar12->_M_t)._M_impl.super__Rb_tree_header) {
            _Var1 = p_Var14[1]._M_color;
            if (_Var1 != ~_S_red) {
              pmVar9 = std::
                       map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                       operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                   *)&local_60,&local_1e4);
              p_Var13 = (_Rb_tree_color *)
                        std::
                        map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                        operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    *)local_1b0,pmVar9);
              *p_Var13 = _Var1;
              psVar22 = local_180.fStore;
              kVar16 = local_1e4;
            }
            p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
            psVar12 = psVar22 + kVar16;
          }
          lVar11 = std::_Rb_tree_decrement(&local_1a8);
          local_1e0 = *(int *)(lVar11 + 0x24);
          pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                               *)&local_60,&local_1e0);
          iVar21 = *pmVar9;
          pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                               *)&local_60,&local_1e4);
          iVar20 = local_1dc;
          iVar7 = *pmVar9;
          pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                               *)&local_60,&local_1e0);
          *pmVar9 = iVar7 + iVar21;
          pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                               *)&local_60,&local_1e4);
          *pmVar9 = 0;
          iVar21 = *(int *)((long)&(local_120.super_TPZManVector<TPZCompElSide,_10>.
                                    super_TPZVec<TPZCompElSide>.fStore)->fEl + (long)local_1e0 * 4);
          if (iVar21 == -1) {
            *(int *)((long)&(local_120.super_TPZManVector<TPZCompElSide,_10>.
                             super_TPZVec<TPZCompElSide>.fStore)->fEl + (long)local_1e0 * 4) =
                 (int)local_1d8;
            *(int *)((long)&(local_120.super_TPZManVector<TPZCompElSide,_10>.
                             super_TPZVec<TPZCompElSide>.fStore)->fEl + (long)local_1e4 * 4) =
                 (int)local_1d8;
            lVar11 = local_1d8 + 1;
          }
          else {
            *(int *)((long)&(local_120.super_TPZManVector<TPZCompElSide,_10>.
                             super_TPZVec<TPZCompElSide>.fStore)->fEl + (long)local_1e4 * 4) =
                 iVar21;
            lVar11 = local_1d8;
          }
          std::
          _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                       *)local_1b0);
        }
        else if (*(int *)((long)&(local_120.super_TPZManVector<TPZCompElSide,_10>.
                                  super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar17 * 4) == -1) {
          *(undefined4 *)
           ((long)&(local_120.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                   fStore)->fEl + lVar17 * 4) = uVar6;
          lVar11 = lVar11 + 1;
        }
      }
      local_1e4 = local_1e4 + 1;
    } while (local_1e4 < iVar20);
  }
  uVar5 = (uint)local_1c8->fNElements;
  if (0 < (int)uVar5) {
    piVar3 = local_1c8->fStore;
    uVar18 = 0;
    do {
      piVar3[uVar18] =
           *(int *)((long)&(local_120.super_TPZManVector<TPZCompElSide,_10>.
                            super_TPZVec<TPZCompElSide>.fStore)->fEl + (long)piVar3[uVar18] * 4);
      uVar18 = uVar18 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar18);
  }
  TPZManVector<int,_10>::~TPZManVector((TPZManVector<int,_10> *)&local_120);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_60);
  local_180._vptr_TPZVec = (_func_int **)&PTR__TPZVec_019ed9f0;
  if (local_180.fStore != (set<int,_std::less<int>,_std::allocator<int>_> *)0x0) {
    sVar4 = local_180.fStore[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if (sVar4 != 0) {
      lVar17 = sVar4 * 0x30;
      do {
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                  (&local_180.fStore[-1]._M_t._M_impl.field_0x0 + lVar17));
        lVar17 = lVar17 + -0x30;
      } while (lVar17 != 0);
    }
    operator_delete__(&local_180.fStore[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      sVar4 * 0x30 + 8);
  }
  return (int)lVar11;
}

Assistant:

int  TPZDohrStructMatrix<TVar,TPar>::ClusterIslands(TPZVec<int> &domain_index,int nsub,int connectdimension)
{
    int meshdim = this->fMesh->Dimension();
    int64_t nel = this->fMesh->NElements();
    int64_t mincount = nel/nsub/20;
    // contains for each subdomain the set of neighbouring domains
    TPZVec<std::set<int> > domain_neighbours(nsub);
    // contains for each domain the number of cells within that domain
    std::map<int,int> domain_index_count;
    int64_t iel;
    for (iel=0; iel<nel; iel++) {
        TPZCompEl *cel = this->fMesh->ElementVec()[iel];
        if (!cel) {
            continue;
        }
        int mydomainindex = domain_index[cel->Index()];
        //        if (mydomainindex == 0) {
        //            std::stringstream sout;
        //            cel->Print(sout);
        //            TPZGeoEl *gel = cel->Reference();
        //            if (gel) {
        //                gel->Print(sout);
        //            }
        //            LOGPZ_DEBUG(logger, sout.str())
        //        }
        domain_index_count[mydomainindex]++;
        TPZGeoEl *gel = cel->Reference();
        if (!gel) {
            continue;
        }
        int nsides = gel->NSides();
        int geldim = gel->Dimension();
        int is;
        for (is=0; is<nsides; is++) {
            int sidedim = gel->SideDimension(is);
            if (sidedim != connectdimension && geldim>=connectdimension) {
                continue;
            }
            if (geldim < connectdimension && is != nsides-1)
            {
                continue;
            }
            TPZGeoElSide gelside(gel,is);
            TPZStack<TPZCompElSide> elsidevec;
            gelside.ConnectedCompElementList(elsidevec, 0, 0);
            int64_t nneigh = elsidevec.NElements();
            int64_t neigh;
            int64_t nneighvalid = 0;
            for (neigh = 0; neigh <nneigh; neigh++) {
                TPZCompElSide celside = elsidevec[neigh];
                TPZCompEl *celloc = celside.Element();
                TPZGeoEl *gelloc = celloc->Reference();
                if (gelloc->Dimension() != meshdim) {
                    continue;
                }
                nneighvalid++;
                int celdomain = domain_index[celloc->Index()];
                if (celdomain != mydomainindex)
                {
                    domain_neighbours[mydomainindex].insert(celdomain);
                }
            }
            if (nneighvalid == 0)
            {
                // include the boundary as a ficticious neighbour index
                domain_neighbours[mydomainindex].insert(-1);
            }
        }
    }
#ifdef PZ_LOG
    if(logger.isDebugEnabled())
    {
        std::stringstream sout;
        for (int64_t i=0; i<domain_neighbours.size(); i++) {
            std::set<int>::const_iterator it;
            sout << "Domain index " << i << " neighbours ";
            for (it=domain_neighbours[i].begin(); it != domain_neighbours[i].end(); it++) {
                sout << *it << " ";
            }
            sout << std::endl;
        }
        std::map<int,int>::const_iterator it = domain_index_count.begin();
        while (it != domain_index_count.end()) {
            sout << "Domain index " << it->first << " number of elements " << it->second << std::endl;
            it++;
        }
        LOGPZ_DEBUG(logger, sout.str())
        
    }
#endif
    // compute a destination domain index for each domain (used for clustering domains)
    int isub;
    TPZManVector<int> domain_dest(nsub,-1);
    int64_t count = 0;
    for (isub=0; isub < nsub; isub++)
    {
        // if the subdomain is neighbour to only one subdomain
        // this means that the subdomain is isolated (only boundaries as neighbours) (not treated)
        // or that the domain is embedded in another domain
        if (domain_neighbours[isub].size() == 1 )
        {
            // merge both subdomains
            int target = *(domain_neighbours[isub].begin());
            // target == -1 is not treated here
            if (target == -1) {
                continue;
            }
            if (domain_dest[target] == -1 && domain_dest[isub] == -1)
            {
                domain_dest[isub] = count;
                domain_dest[target] = count;
                count++;
            }
            else if (domain_dest[target] == -1)
            {
                domain_dest[target] = domain_dest[isub];
            }
            else
            {
                domain_dest[isub] = domain_dest[target];
            }
            
        }
        else if(domain_dest[isub] == -1 && domain_index_count[isub] < mincount)
        {
            // the domain has very little elements
            // the domain has at least two neighbouring domains (may include the ficticious -1 domain)
            std::map<int,int> sizeDomain;
            std::set<int>::iterator it;
            for (it = domain_neighbours[isub].begin(); it != domain_neighbours[isub].end(); it++) {
                if (*it != -1) {
                    sizeDomain[domain_index_count[isub]] = *it;
                }
            }
            int domaintargetindex = sizeDomain.rbegin()->second;
            int destdomainindexcount = domain_index_count[domaintargetindex];
            int domainshrinkcount = domain_index_count[isub];
            domain_index_count[domaintargetindex] = destdomainindexcount+domainshrinkcount;
            domain_index_count[isub] = 0;
            if(domain_dest[domaintargetindex] == -1)
            {
                domain_dest[domaintargetindex] = count;
                domain_dest[isub] = count;
                count++;
            }
            else {
                domain_dest[isub] = domain_dest[domaintargetindex];
            }
            
        }
        else if (domain_dest[isub] == -1)
        {
            domain_dest[isub] = count++;
        }
    }
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
    {
        std::stringstream sout;
        int isub;
        for (isub=0; isub < nsub; isub++) {
            sout << "isub = " << isub << " number of neighbours " << domain_neighbours[isub].size() << " domains ";
            std::set<int>::iterator it;
            for (it = domain_neighbours[isub].begin(); it != domain_neighbours[isub].end(); it++) {
                sout << *it << " ";
            }
            sout << std::endl;
        }
        sout << "Destination domain " << domain_dest << std::endl;
        LOGPZ_DEBUG(logger,sout.str())
    }
#endif
    int domsize = domain_index.NElements();
    int d;
    for (d=0; d<domsize; d++) {
        domain_index[d] = domain_dest[domain_index[d]];
    }
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
    {
        std::stringstream sout;
        sout << "Number of elements per domain ";
        std::map<int,int>::iterator it;
        int64_t count = 0;
        for (it=domain_index_count.begin(); it != domain_index_count.end(); it++) {
            if (! (count++ %40)) {
                sout << std::endl;
            }
            sout << it->first << " " << it->second << " ";
        }
        LOGPZ_DEBUG(logger,sout.str())
    }
#endif
    
    return count;
}